

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O3

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
getPredefinedTransformations1L1Q1P<float>
          (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           *__return_storage_ptr__,Matrix<float,_4,_1,_0,_4,_1> *P1,
          Matrix<float,_4,_1,_0,_4,_1> *P1_B,Matrix<float,_4,_1,_0,_4,_1> *Pi,
          Matrix<float,_4,_1,_0,_4,_1> *Pi_B)

{
  iterator __position;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>> *this;
  Matrix<float,_3,_1,_0,_3,_1> *pMVar5;
  Index inner;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
  *eval;
  scalar_sum_op<float,_float> *func;
  SrcXprType *src;
  Index index;
  long lVar6;
  CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>
  *xpr;
  Index index_1;
  Scalar SVar7;
  float fVar8;
  float fVar13;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar14;
  float fVar15;
  RealScalar z_3;
  float fVar16;
  RealScalar z_1;
  float fVar17;
  RealScalar z;
  float fVar18;
  Matrix<float,_4,_4,_0,_4,_4> TP_B;
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  *out;
  Matrix<float,_4,_4,_0,_4,_4> TP;
  Matrix<float,_4,_4,_0,_4,_4> transU_B;
  Matrix<float,_4,_4,_0,_4,_4> transU;
  Matrix<float,_4,_4,_0,_4,_4> transV;
  Matrix<float,_4,_4,_0,_4,_4> transV_B;
  Matrix<float,_4,_1,_0,_4,_1> P1_pi_B;
  Matrix<float,_4,_1,_0,_4,_1> P1_pi;
  Matrix<float,_4,_1,_0,_4,_1> Pi_B1;
  Matrix<float,_4,_1,_0,_4,_1> Pi_1;
  undefined8 local_274;
  float fStack_26c;
  Matrix<float,_3,_1,_0,_3,_1> local_268;
  Matrix<float,_4,_1,_0,_4,_1> *local_258;
  Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> local_250;
  Matrix<float,_4,_4,_0,_4,_4> local_248;
  vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>> *local_200;
  undefined1 local_1f8 [8];
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8 [16];
  undefined1 local_178 [8];
  undefined8 uStack_170;
  undefined1 local_168 [8];
  undefined8 uStack_160;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [4];
  undefined1 auStack_134 [4];
  undefined1 auStack_130 [16];
  undefined8 uStack_120;
  undefined8 local_118;
  float afStack_110 [4];
  undefined8 uStack_100;
  variable_if_dynamic<long,__1> local_f8;
  CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>
  *local_f0;
  Matrix<float,_4,_1,_0,_4,_1> *local_e8;
  variable_if_dynamic<long,__1> local_e0;
  Index local_d0;
  undefined1 local_b8 [8];
  Matrix<float,_4,_4,_0,_4,_4> MStack_b0;
  undefined4 local_6c;
  float afStack_68 [5];
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  auStack_130._0_8_ = 3;
  lVar6 = 0;
  local_118 = 0;
  afStack_110[2] = 5.60519e-45;
  afStack_110[3] = 0.0;
  local_f8.m_value = 3;
  local_e0.m_value = 0;
  local_d0 = 4;
  uStack_170 = P1;
  uStack_160 = Pi;
  local_258 = Pi_B;
  local_200 = (vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
               *)__return_storage_ptr__;
  _local_138 = P1;
  uStack_120 = P1;
  uStack_100 = Pi;
  local_e8 = Pi;
  SVar7 = Eigen::internal::
          redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>const,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>const>>,3,0>
          ::
          run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const>>
                    ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
                      *)local_178,(scalar_sum_op<float,_float> *)local_1b8,
                     (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>
                      *)local_138);
  fVar8 = (Pi->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [3];
  do {
    afStack_68[lVar6] =
         (P1->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
         [lVar6] - (Pi->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.
                   m_data.array[lVar6] * (SVar7 + fVar8);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  afStack_68[3] = 1.0;
  xpr = (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>
         *)local_138;
  auStack_130._0_8_ = 3;
  lVar6 = 0;
  local_118 = 0;
  afStack_110[2] = 5.60519e-45;
  afStack_110[3] = 0.0;
  uStack_100 = local_258;
  local_f8.m_value = 3;
  local_e8 = local_258;
  local_e0.m_value = 0;
  local_d0 = 4;
  eval = (redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
          *)local_178;
  uStack_170 = P1_B;
  uStack_160 = local_258;
  func = (scalar_sum_op<float,_float> *)local_1b8;
  _local_138 = P1_B;
  uStack_120 = P1_B;
  SVar7 = Eigen::internal::
          redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>const,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>const>>,3,0>
          ::
          run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const>>
                    (eval,func,xpr);
  fVar8 = (local_258->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
          array[3];
  do {
    MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
    [lVar6 + 0xe] =
         (P1_B->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
         [lVar6] - (local_258->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
                   m_storage.m_data.array[lVar6] * (SVar7 + fVar8);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_6c = 0x3f800000;
  _local_178 = ZEXT416(0);
  _local_168 = _local_178;
  _local_158 = _local_178;
  _local_148 = _local_178;
  lVar6 = 0;
  do {
    *(undefined4 *)
     &(eval->
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
      ).
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
      .m_d = 0x3f800000;
    lVar6 = lVar6 + 0x10;
    eval = (redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
            *)((long)&(eval->
                      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
                      ).
                      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
                      .m_d.lhsImpl.
                      super_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>
                      .
                      super_block_evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false,_true>
                      .
                      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>
              + 0xc);
  } while (lVar6 != 0x40);
  lVar6 = 0;
  do {
    *(float *)(local_148 + lVar6 * 4) = -afStack_68[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_1b8[0xc] = 0.0;
  local_1b8[0xd] = 0.0;
  local_1b8[0xe] = 0.0;
  local_1b8[0xf] = 0.0;
  local_1b8[8] = 0.0;
  local_1b8[9] = 0.0;
  local_1b8[10] = 0.0;
  local_1b8[0xb] = 0.0;
  local_1b8[4] = 0.0;
  local_1b8[5] = 0.0;
  local_1b8[6] = 0.0;
  local_1b8[7] = 0.0;
  local_1b8[0] = 0.0;
  local_1b8[1] = 0.0;
  local_1b8[2] = 0.0;
  local_1b8[3] = 0.0;
  lVar6 = 0;
  do {
    *(undefined4 *)func = 0x3f800000;
    lVar6 = lVar6 + 0x10;
    func = func + 0x14;
  } while (lVar6 != 0x40);
  lVar6 = 0;
  do {
    local_1b8[lVar6 + 0xc] =
         -MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[lVar6 + 0xe];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_b8 = (undefined1  [8])local_178;
  MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_
       = Pi;
  Eigen::internal::
  Assignment<Eigen::Matrix<float,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<float,_4,_4,_1,_4,_4> *)xpr,(SrcXprType *)local_b8,
        (assign_op<float,_float> *)local_1f8);
  local_f8.m_value._0_4_ =
       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0];
  local_f8.m_value._4_4_ =
       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [1];
  local_e8 = (Matrix<float,_4,_1,_0,_4,_1> *)
             MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array._0_8_;
  local_e0.m_value = 4;
  if ((MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
       _0_8_ & 0xf) == 0) {
    fVar8 = (((PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
             MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array._0_8_)->m_storage).m_data.array[0];
    fVar13 = (((PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
              MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array._0_8_)->m_storage).m_data.array[1];
    fVar14 = (((PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
              MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array._0_8_)->m_storage).m_data.array[2];
    fVar15 = (((PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
              MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array._0_8_)->m_storage).m_data.array[3];
    local_48 = (float)auStack_130._4_4_ * fVar15 + (float)auStack_134 * fVar13 +
               (float)auStack_130._0_4_ * fVar14 + (float)local_138 * fVar8;
    fStack_44 = uStack_120._4_4_ * fVar15 + (float)auStack_130._12_4_ * fVar13 +
                (float)uStack_120 * fVar14 + (float)auStack_130._8_4_ * fVar8;
    fStack_40 = afStack_110[1] * fVar15 + local_118._4_4_ * fVar13 +
                afStack_110[0] * fVar14 + (float)local_118 * fVar8;
    fStack_3c = fVar15 * uStack_100._4_4_ + fVar13 * afStack_110[3] +
                fVar14 * (float)uStack_100 + fVar8 * afStack_110[2];
    local_b8 = (undefined1  [8])local_1b8;
    src = (SrcXprType *)local_b8;
    MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _0_8_ = local_258;
    local_f0 = xpr;
    Eigen::internal::
    Assignment<Eigen::Matrix<float,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
    ::run((Matrix<float,_4,_4,_1,_4,_4> *)xpr,src,(assign_op<float,_float> *)local_1f8);
    local_f8.m_value._0_4_ =
         MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
         array[0];
    local_f8.m_value._4_4_ =
         MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
         array[1];
    local_e8 = (Matrix<float,_4,_1,_0,_4,_1> *)
               MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array._0_8_;
    local_e0.m_value = 4;
    if ((MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
         array._0_8_ & 0xf) == 0) {
      fVar8 = (((PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
               MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array._0_8_)->m_storage).m_data.array[0];
      fVar13 = (((PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
                MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array._0_8_)->m_storage).m_data.array[1];
      fVar14 = (((PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
                MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array._0_8_)->m_storage).m_data.array[2];
      fVar15 = (((PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
                MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array._0_8_)->m_storage).m_data.array[3];
      afStack_68[4] =
           (float)auStack_130._4_4_ * fVar15 + (float)auStack_134 * fVar13 +
           (float)auStack_130._0_4_ * fVar14 + (float)local_138 * fVar8;
      fStack_54 = uStack_120._4_4_ * fVar15 + (float)auStack_130._12_4_ * fVar13 +
                  (float)uStack_120 * fVar14 + (float)auStack_130._8_4_ * fVar8;
      fStack_50 = afStack_110[1] * fVar15 + local_118._4_4_ * fVar13 +
                  afStack_110[0] * fVar14 + (float)local_118 * fVar8;
      fStack_4c = fVar15 * uStack_100._4_4_ + fVar13 * afStack_110[3] +
                  fVar14 * (float)uStack_100 + fVar8 * afStack_110[2];
      _local_138 = (Matrix<float,_4,_1,_0,_4,_1> *)0x0;
      auStack_130._0_8_ = 0;
      auStack_130._8_4_ = 0.0;
      auStack_130._12_4_ = 0.0;
      uStack_120 = (XprTypeNested)0x0;
      local_118 = 0;
      afStack_110[0] = 0.0;
      afStack_110[1] = 0.0;
      afStack_110[2] = 0.0;
      afStack_110[3] = 0.0;
      uStack_100 = (Matrix<float,_4,_1,_0,_4,_1> *)0x0;
      lVar6 = 0;
      local_f0 = xpr;
      do {
        *(undefined4 *)
         &(xpr->m_lhs).
          super_BlockImpl<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_0>.m_data =
             0x3f800000;
        lVar6 = lVar6 + 0x10;
        xpr = (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>
               *)&(xpr->m_lhs).
                  super_BlockImpl<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense>.
                  super_BlockImpl_dense<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
                  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_1>.
                  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_0>.
                  field_0x14;
      } while (lVar6 != 0x40);
      MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [10] = 0.0;
      MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xb] = 0.0;
      MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xc] = 0.0;
      MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xd] = 0.0;
      MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [6] = 0.0;
      MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [7] = 0.0;
      MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [8] = 0.0;
      MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [9] = 0.0;
      MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [2] = 0.0;
      MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [3] = 0.0;
      MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [4] = 0.0;
      MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [5] = 0.0;
      local_b8 = (undefined1  [8])0x0;
      MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = 0.0;
      MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [1] = 0.0;
      lVar6 = 0;
      do {
        *(undefined4 *)&(src->m_xpr).m_matrix = 0x3f800000;
        lVar6 = lVar6 + 0x10;
        src = (SrcXprType *)((long)&src[2].m_xpr.m_matrix + 4);
      } while (lVar6 != 0x40);
      local_1f8 = (undefined1  [8])&local_48;
      uStack_1f0 = 3;
      local_1d8 = 0;
      local_1c8 = 4;
      uStack_1e0 = (XprTypeNested)local_1f8;
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::
      normalized((PlainObject *)&local_248,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
                 local_1f8);
      if (CONCAT44(local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[5],
                   local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[4]) != 3) {
LAB_0014d78f:
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<float, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, 3, 1>]"
                     );
      }
      local_274._0_4_ =
           local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0];
      local_274._4_4_ =
           local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[1];
      fStack_26c = local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[2];
      fVar14 = local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0] * -0.0 +
               local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[1];
      fVar8 = local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[2] * 0.0 +
              local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[1] * -0.0;
      fVar13 = local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0] * 0.0 +
               -local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[2];
      auVar10._0_8_ = CONCAT44(fVar13,fVar8);
      auVar10._8_4_ =
           local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[2] * 0.0 + -0.0;
      auVar10._12_4_ =
           local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[2] * 0.0 + -0.0;
      fVar15 = local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[1] * -0.0 +
               local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[2];
      fVar17 = fVar13 * fVar13 + fVar14 * fVar14 + fVar8 * fVar8;
      fVar13 = SQRT(fVar17);
      local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[1] * 0.0 +
            -local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[0];
      fVar8 = local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0] * 0.0 +
              local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[2] * -0.0;
      fVar18 = fVar8 * fVar8 +
               local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2] *
               local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2] + fVar15 * fVar15;
      fVar16 = SQRT(fVar18);
      if (fVar16 <= fVar13) {
        local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [2] = fVar14;
        if (0.0 < fVar17) {
          local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2] = fVar14 / fVar13;
          auVar2._4_4_ = fVar13;
          auVar2._0_4_ = fVar13;
          auVar2._8_4_ = fVar13;
          auVar2._12_4_ = fVar13;
          auVar10 = divps(auVar10,auVar2);
        }
      }
      else {
        auVar9._8_4_ = 0;
        auVar9._4_4_ = fVar8;
        auVar9._12_4_ =
             local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[2] + 0.0;
        auVar9._0_4_ = fVar15;
        auVar10._0_8_ = auVar9._0_8_;
        if (0.0 < fVar18) {
          local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2] = local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[2] / fVar16;
          auVar3._4_4_ = fVar16;
          auVar3._0_4_ = fVar16;
          auVar3._8_4_ = fVar16;
          auVar3._12_4_ = fVar16;
          auVar10 = divps(auVar9,auVar3);
        }
      }
      local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = (float)auVar10._0_8_;
      local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = (float)((ulong)auVar10._0_8_ >> 0x20);
      uStack_1f0 = 1;
      local_1e8 = 3;
      local_1d8 = 0;
      uStack_1d0 = 0;
      local_1c8 = 4;
      local_1f8 = (undefined1  [8])local_138;
      uStack_1e0 = (Matrix<float,_4,_4,_0,_4,_4> *)local_138;
      local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
      _0_8_ = &local_268;
      Eigen::internal::
      check_for_aliasing<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
                ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_1f8,
                 (Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_248);
      local_274 = (Matrix<float,_3,_1,_0,_3,_1> *)CONCAT44(local_274._4_4_,(float)local_274);
      if ((uStack_1f0 == 1) &&
         (local_274 = (Matrix<float,_3,_1,_0,_3,_1> *)CONCAT44(local_274._4_4_,(float)local_274),
         local_1e8 == 3)) {
        lVar6 = 0;
        do {
          (((PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_1f8)->m_storage).m_data.
          array[lVar6] = *(float *)((long)(((PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *
                                            )local_248.
                                             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                                             .m_storage.m_data.array._0_8_)->m_storage).m_data.array
                                   + lVar6);
          lVar6 = lVar6 + 4;
        } while (lVar6 != 0xc);
        local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0] = local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[2] * local_274._4_4_ -
              fStack_26c *
              local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[1];
        local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [1] = local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[0] * fStack_26c -
              (float)local_274 *
              local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[2];
        local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [2] = (float)local_274 *
              local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[1] -
              local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[0] * local_274._4_4_;
        local_1f8 = (undefined1  [8])(local_138 + 4);
        uStack_1f0 = 1;
        local_1e8 = 3;
        local_1d8 = 1;
        uStack_1d0 = 0;
        local_1c8 = 4;
        local_250.m_matrix = (non_const_type)&local_248;
        uStack_1e0 = (Matrix<float,_4,_4,_0,_4,_4> *)local_138;
        Eigen::internal::
        check_for_aliasing<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
                  ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_1f8,&local_250
                  );
        local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        ._0_8_ = (Matrix<float,_3,_1,_0,_3,_1> *)
                 CONCAT44(local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[1],
                          local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0]);
        local_274 = (Matrix<float,_3,_1,_0,_3,_1> *)CONCAT44(local_274._4_4_,(float)local_274);
        if ((uStack_1f0 == 1) &&
           (local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array._0_8_ = (Matrix<float,_3,_1,_0,_3,_1> *)
                          CONCAT44(local_248.
                                   super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                   m_storage.m_data.array[1],
                                   local_248.
                                   super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                   m_storage.m_data.array[0]),
           local_274 = (Matrix<float,_3,_1,_0,_3,_1> *)CONCAT44(local_274._4_4_,(float)local_274),
           local_1e8 == 3)) {
          lVar6 = 0;
          do {
            (((PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_1f8)->m_storage).m_data
            .array[lVar6] =
                 *(float *)((long)((local_250.m_matrix)->
                                  super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).
                                  m_storage.m_data.array + lVar6);
            lVar6 = lVar6 + 4;
          } while (lVar6 != 0xc);
          local_1f8 = (undefined1  [8])auStack_130;
          uStack_1f0 = 1;
          local_1e8 = 3;
          local_1d8 = 2;
          uStack_1d0 = 0;
          local_1c8 = 4;
          uStack_1e0 = (Matrix<float,_4,_4,_0,_4,_4> *)local_138;
          local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array._0_8_ = (Matrix<float,_3,_1,_0,_3,_1> *)&local_274;
          Eigen::internal::
          check_for_aliasing<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
                    ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_1f8,
                     (Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_248);
          local_274 = (Matrix<float,_3,_1,_0,_3,_1> *)CONCAT44(local_274._4_4_,(float)local_274);
          if ((uStack_1f0 == 1) &&
             (local_274 = (Matrix<float,_3,_1,_0,_3,_1> *)CONCAT44(local_274._4_4_,(float)local_274)
             , local_1e8 == 3)) {
            lVar6 = 0;
            do {
              (((PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_1f8)->m_storage).
              m_data.array[lVar6] =
                   *(float *)((long)(((PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                                     local_248.
                                     super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                     m_storage.m_data.array._0_8_)->m_storage).m_data.array + lVar6)
              ;
              lVar6 = lVar6 + 4;
            } while (lVar6 != 0xc);
            local_1f8 = (undefined1  [8])(afStack_68 + 4);
            uStack_1f0 = 3;
            local_1d8 = 0;
            local_1c8 = 4;
            uStack_1e0 = (XprTypeNested)local_1f8;
            Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::
            normalized((PlainObject *)&local_248,
                       (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>
                        *)local_1f8);
            if (CONCAT44(local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                         m_storage.m_data.array[5],
                         local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                         m_storage.m_data.array[4]) != 3) goto LAB_0014d78f;
            fStack_26c = local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                         m_storage.m_data.array[2];
            fVar14 = local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                     .m_data.array[0] * -0.0 +
                     local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                     .m_data.array[1];
            fVar8 = local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[2] * 0.0 +
                    local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[1] * -0.0;
            fVar13 = local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                     .m_data.array[0] * 0.0 +
                     -local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[2];
            auVar11._0_8_ = CONCAT44(fVar13,fVar8);
            auVar11._8_4_ =
                 local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[2] * 0.0 + -0.0;
            auVar11._12_4_ =
                 local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[2] * 0.0 + -0.0;
            fVar15 = local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                     .m_data.array[1] * -0.0 +
                     local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                     .m_data.array[2];
            fVar16 = fVar13 * fVar13 + fVar14 * fVar14 + fVar8 * fVar8;
            fVar13 = SQRT(fVar16);
            local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2] = local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[1] * 0.0 +
                       -local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0];
            fVar8 = local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0] * 0.0 +
                    local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[2] * -0.0;
            fVar18 = fVar8 * fVar8 +
                     local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[2] *
                     local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[2] + fVar15 * fVar15;
            fVar17 = SQRT(fVar18);
            if (fVar17 <= fVar13) {
              local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[2] = fVar14;
              if (0.0 < fVar16) {
                local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[2] = fVar14 / fVar13;
                auVar1._4_4_ = fVar13;
                auVar1._0_4_ = fVar13;
                auVar1._8_4_ = fVar13;
                auVar1._12_4_ = fVar13;
                auVar10 = divps(auVar11,auVar1);
                auVar11._0_8_ = auVar10._0_8_;
              }
            }
            else {
              auVar12._8_4_ = 0;
              auVar12._4_4_ = fVar8;
              auVar12._12_4_ =
                   local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[2] + 0.0;
              auVar12._0_4_ = fVar15;
              auVar11._0_8_ = auVar12._0_8_;
              if (0.0 < fVar18) {
                local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[2] =
                     local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[2] / fVar17;
                auVar4._4_4_ = fVar17;
                auVar4._0_4_ = fVar17;
                auVar4._8_4_ = fVar17;
                auVar4._12_4_ = fVar17;
                auVar10 = divps(auVar12,auVar4);
                auVar11._0_8_ = auVar10._0_8_;
              }
            }
            local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0] = (float)auVar11._0_8_;
            local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1] = (float)((ulong)auVar11._0_8_ >> 0x20);
            uStack_1f0 = 1;
            local_1e8 = 3;
            local_1d8 = 0;
            uStack_1d0 = 0;
            local_1c8 = 4;
            local_1f8 = (undefined1  [8])local_b8;
            uStack_1e0 = (Matrix<float,_4,_4,_0,_4,_4> *)local_b8;
            pMVar5 = &local_268;
            local_274 = (Matrix<float,_3,_1,_0,_3,_1> *)
                        local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array._0_8_;
            Eigen::internal::
            check_for_aliasing<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
                      ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_1f8,
                       (Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_248);
            local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array._0_8_ = pMVar5;
            if ((uStack_1f0 == 1) && (local_1e8 == 3)) {
              lVar6 = 0;
              do {
                (((PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_1f8)->m_storage).
                m_data.array[lVar6] =
                     *(float *)((long)(((PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                                       local_248.
                                       super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                       m_storage.m_data.array._0_8_)->m_storage).m_data.array +
                               lVar6);
                lVar6 = lVar6 + 4;
              } while (lVar6 != 0xc);
              local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0] = local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[2] * local_274._4_4_ -
                          fStack_26c *
                          local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[1];
              local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[1] = local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[0] * fStack_26c -
                          (float)local_274 *
                          local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[2];
              local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[2] = (float)local_274 *
                          local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[1] -
                          local_268.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[0] * local_274._4_4_;
              local_1f8 = (undefined1  [8])(local_b8 + 4);
              uStack_1f0 = 1;
              local_1e8 = 3;
              local_1d8 = 1;
              uStack_1d0 = 0;
              local_1c8 = 4;
              local_250.m_matrix = (non_const_type)&local_248;
              uStack_1e0 = (Matrix<float,_4,_4,_0,_4,_4> *)local_b8;
              Eigen::internal::
              check_for_aliasing<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
                        ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_1f8,
                         &local_250);
              local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array._0_8_ = (Matrix<float,_3,_1,_0,_3,_1> *)
                             CONCAT44(local_248.
                                      super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                      m_storage.m_data.array[1],
                                      local_248.
                                      super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                      m_storage.m_data.array[0]);
              if ((uStack_1f0 == 1) &&
                 (local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array._0_8_ =
                       (Matrix<float,_3,_1,_0,_3,_1> *)
                       CONCAT44(local_248.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[1],
                                local_248.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0]), local_1e8 == 3)) {
                lVar6 = 0;
                do {
                  (((PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_1f8)->m_storage).
                  m_data.array[lVar6] =
                       *(float *)((long)((local_250.m_matrix)->
                                        super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>)
                                        .m_storage.m_data.array + lVar6);
                  lVar6 = lVar6 + 4;
                } while (lVar6 != 0xc);
                local_1f8 = (undefined1  [8])&MStack_b0;
                uStack_1f0 = 1;
                local_1e8 = 3;
                local_1d8 = 2;
                uStack_1d0 = 0;
                local_1c8 = 4;
                uStack_1e0 = (Matrix<float,_4,_4,_0,_4,_4> *)local_b8;
                local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array._0_8_ = (Matrix<float,_3,_1,_0,_3,_1> *)&local_274;
                Eigen::internal::
                check_for_aliasing<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
                          ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_1f8,
                           (Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_248);
                this = local_200;
                if ((uStack_1f0 == 1) && (local_1e8 == 3)) {
                  lVar6 = 0;
                  do {
                    (((PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_1f8)->m_storage
                    ).m_data.array[lVar6] =
                         *(float *)((long)(((PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *
                                            )local_248.
                                             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                                             .m_storage.m_data.array._0_8_)->m_storage).m_data.array
                                   + lVar6);
                    lVar6 = lVar6 + 4;
                  } while (lVar6 != 0xc);
                  *(undefined8 *)local_200 = 0;
                  *(undefined8 *)(local_200 + 8) = 0;
                  *(undefined8 *)(local_200 + 0x10) = 0;
                  fStack_1c0 = fStack_13c * (float)uStack_100 +
                               fStack_140 * afStack_110[0] +
                               (float)local_148._4_4_ * (float)uStack_120 +
                               (float)local_148._0_4_ * (float)auStack_130._0_4_;
                  fStack_1bc = fStack_13c * uStack_100._4_4_ +
                               fStack_140 * afStack_110[1] +
                               (float)local_148._4_4_ * uStack_120._4_4_ +
                               (float)local_148._0_4_ * (float)auStack_130._4_4_;
                  local_1f8._4_4_ =
                       uStack_170._4_4_ * afStack_110[3] +
                       (float)uStack_170 * local_118._4_4_ +
                       (float)local_178._4_4_ * (float)auStack_130._12_4_ +
                       (float)local_178._0_4_ * (float)auStack_134;
                  local_1f8._0_4_ =
                       uStack_170._4_4_ * afStack_110[2] +
                       (float)uStack_170 * (float)local_118 +
                       (float)local_178._4_4_ * (float)auStack_130._8_4_ +
                       (float)local_178._0_4_ * (float)local_138;
                  uStack_1f0._4_4_ =
                       uStack_170._4_4_ * uStack_100._4_4_ +
                       (float)uStack_170 * afStack_110[1] +
                       (float)local_178._4_4_ * uStack_120._4_4_ +
                       (float)local_178._0_4_ * (float)auStack_130._4_4_;
                  uStack_1f0._0_4_ =
                       uStack_170._4_4_ * (float)uStack_100 +
                       (float)uStack_170 * afStack_110[0] +
                       (float)local_178._4_4_ * (float)uStack_120 +
                       (float)local_178._0_4_ * (float)auStack_130._0_4_;
                  local_1e8._4_4_ =
                       uStack_160._4_4_ * afStack_110[3] +
                       (float)uStack_160 * local_118._4_4_ +
                       (float)local_168._4_4_ * (float)auStack_130._12_4_ +
                       (float)local_168._0_4_ * (float)auStack_134;
                  local_1e8._0_4_ =
                       uStack_160._4_4_ * afStack_110[2] +
                       (float)uStack_160 * (float)local_118 +
                       (float)local_168._4_4_ * (float)auStack_130._8_4_ +
                       (float)local_168._0_4_ * (float)local_138;
                  uStack_1e0 = (XprTypeNested)
                               CONCAT44(uStack_160._4_4_ * uStack_100._4_4_ +
                                        (float)uStack_160 * afStack_110[1] +
                                        (float)local_168._4_4_ * uStack_120._4_4_ +
                                        (float)local_168._0_4_ * (float)auStack_130._4_4_,
                                        uStack_160._4_4_ * (float)uStack_100 +
                                        (float)uStack_160 * afStack_110[0] +
                                        (float)local_168._4_4_ * (float)uStack_120 +
                                        (float)local_168._0_4_ * (float)auStack_130._0_4_);
                  local_1d8._4_4_ =
                       fStack_14c * afStack_110[3] +
                       fStack_150 * local_118._4_4_ +
                       (float)local_158._4_4_ * (float)auStack_130._12_4_ +
                       (float)local_158._0_4_ * (float)auStack_134;
                  local_1d8._0_4_ =
                       fStack_14c * afStack_110[2] +
                       fStack_150 * (float)local_118 +
                       (float)local_158._4_4_ * (float)auStack_130._8_4_ +
                       (float)local_158._0_4_ * (float)local_138;
                  uStack_1d0._4_4_ =
                       fStack_14c * uStack_100._4_4_ +
                       fStack_150 * afStack_110[1] +
                       (float)local_158._4_4_ * uStack_120._4_4_ +
                       (float)local_158._0_4_ * (float)auStack_130._4_4_;
                  uStack_1d0._0_4_ =
                       fStack_14c * (float)uStack_100 +
                       fStack_150 * afStack_110[0] +
                       (float)local_158._4_4_ * (float)uStack_120 +
                       (float)local_158._0_4_ * (float)auStack_130._0_4_;
                  local_1c8 = CONCAT44(fStack_13c * afStack_110[3] +
                                       fStack_140 * local_118._4_4_ +
                                       (float)local_148._4_4_ * (float)auStack_130._12_4_ +
                                       (float)local_148._0_4_ * (float)auStack_134,
                                       fStack_13c * afStack_110[2] +
                                       fStack_140 * (float)local_118 +
                                       (float)local_148._4_4_ * (float)auStack_130._8_4_ +
                                       (float)local_148._0_4_ * (float)local_138);
                  std::
                  vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                  ::_M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>const&>
                            (local_200,(iterator)0x0,(Matrix<float,_4,_4,_0,_4,_4> *)local_1f8);
                  __position._M_current = *(Matrix<float,_4,_4,_0,_4,_4> **)(this + 8);
                  local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0] =
                       local_1b8[3] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[10] +
                       local_1b8[2] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[6] +
                       local_1b8[1] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[2] + local_1b8[0] * (float)local_b8._0_4_;
                  local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[1] =
                       local_1b8[3] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xb] +
                       local_1b8[2] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[7] +
                       local_1b8[1] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[3] + local_1b8[0] * (float)local_b8._4_4_;
                  local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[2] =
                       local_1b8[3] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xc] +
                       local_1b8[2] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[8] +
                       local_1b8[1] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[4] +
                       local_1b8[0] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0];
                  local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[3] =
                       local_1b8[3] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xd] +
                       local_1b8[2] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[9] +
                       local_1b8[1] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[5] +
                       local_1b8[0] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[1];
                  local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[4] =
                       local_1b8[7] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[10] +
                       local_1b8[6] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[6] +
                       local_1b8[5] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[2] + local_1b8[4] * (float)local_b8._0_4_;
                  local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[5] =
                       local_1b8[7] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xb] +
                       local_1b8[6] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[7] +
                       local_1b8[5] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[3] + local_1b8[4] * (float)local_b8._4_4_;
                  local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[6] =
                       local_1b8[7] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xc] +
                       local_1b8[6] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[8] +
                       local_1b8[5] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[4] +
                       local_1b8[4] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0];
                  local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[7] =
                       local_1b8[7] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xd] +
                       local_1b8[6] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[9] +
                       local_1b8[5] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[5] +
                       local_1b8[4] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[1];
                  local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[8] =
                       local_1b8[0xb] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[10] +
                       local_1b8[10] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[6] +
                       local_1b8[9] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[2] + local_1b8[8] * (float)local_b8._0_4_;
                  local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[9] =
                       local_1b8[0xb] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xb] +
                       local_1b8[10] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[7] +
                       local_1b8[9] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[3] + local_1b8[8] * (float)local_b8._4_4_;
                  local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[10] =
                       local_1b8[0xb] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xc] +
                       local_1b8[10] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[8] +
                       local_1b8[9] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[4] +
                       local_1b8[8] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0];
                  local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xb] =
                       local_1b8[0xb] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xd] +
                       local_1b8[10] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[9] +
                       local_1b8[9] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[5] +
                       local_1b8[8] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[1];
                  local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xc] =
                       local_1b8[0xf] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[10] +
                       local_1b8[0xe] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[6] +
                       local_1b8[0xd] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[2] + local_1b8[0xc] * (float)local_b8._0_4_;
                  local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xd] =
                       local_1b8[0xf] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xb] +
                       local_1b8[0xe] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[7] +
                       local_1b8[0xd] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[3] + local_1b8[0xc] * (float)local_b8._4_4_;
                  local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xe] =
                       local_1b8[0xf] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xc] +
                       local_1b8[0xe] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[8] +
                       local_1b8[0xd] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[4] +
                       local_1b8[0xc] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0];
                  local_248.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xf] =
                       local_1b8[0xf] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xd] +
                       local_1b8[0xe] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[9] +
                       local_1b8[0xd] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[5] +
                       local_1b8[0xc] *
                       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[1];
                  if (__position._M_current == *(Matrix<float,_4,_4,_0,_4,_4> **)(this + 0x10)) {
                    std::
                    vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                    ::_M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>const&>
                              (this,__position,&local_248);
                  }
                  else {
                    *(ulong *)(((__position._M_current)->
                               super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                               m_storage.m_data.array + 0xc) =
                         CONCAT44(local_248.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[0xd],
                                  local_248.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[0xc]);
                    *(ulong *)(((__position._M_current)->
                               super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                               m_storage.m_data.array + 0xe) =
                         CONCAT44(local_248.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[0xf],
                                  local_248.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[0xe]);
                    *(ulong *)(((__position._M_current)->
                               super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                               m_storage.m_data.array + 8) =
                         CONCAT44(local_248.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[9],
                                  local_248.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[8]);
                    *(ulong *)(((__position._M_current)->
                               super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                               m_storage.m_data.array + 10) =
                         CONCAT44(local_248.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[0xb],
                                  local_248.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[10]);
                    *(ulong *)(((__position._M_current)->
                               super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                               m_storage.m_data.array + 4) =
                         CONCAT44(local_248.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[5],
                                  local_248.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[4]);
                    *(ulong *)(((__position._M_current)->
                               super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                               m_storage.m_data.array + 6) =
                         CONCAT44(local_248.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[7],
                                  local_248.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[6]);
                    *(ulong *)((__position._M_current)->
                              super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage
                              .m_data.array =
                         CONCAT44(local_248.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[1],
                                  local_248.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[0]);
                    *(ulong *)(((__position._M_current)->
                               super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                               m_storage.m_data.array + 2) =
                         CONCAT44(local_248.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[3],
                                  local_248.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[2]);
                    *(Matrix<float,_4,_4,_0,_4,_4> **)(this + 8) = __position._M_current + 1;
                  }
                  return (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                          *)this;
                }
              }
            }
          }
        }
      }
      __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                    "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float, 4, 4>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<float, 4, 4>>]"
                   );
    }
  }
  local_e0.m_value = 4;
  local_f8.m_value =
       MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
       _0_8_;
  local_f0 = xpr;
  local_e8 = (Matrix<float,_4,_1,_0,_4,_1> *)
             MStack_b0.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array._0_8_;
  __assert_fail("((internal::UIntPtr(block.data()) % (((int)1 >= (int)evaluator<XprType>::Alignment) ? (int)1 : (int)evaluator<XprType>::Alignment)) == 0) && \"data is not aligned\""
                ,"/usr/include/eigen3/Eigen/src/Core/CoreEvaluators.h",0x4ca,
                "Eigen::internal::block_evaluator<const Eigen::Matrix<float, 4, 1>, 4, 1, true>::block_evaluator(const XprType &) [ArgType = const Eigen::Matrix<float, 4, 1>, BlockRows = 4, BlockCols = 1, InnerPanel = true, HasDirectAccess = true]"
               );
}

Assistant:

vector<Matrix<floatPrec, 4,4>> getPredefinedTransformations1L1Q1P(
	Matrix<floatPrec, 4,1> P1, Matrix<floatPrec, 4,1> P1_B,
	Matrix<floatPrec, 4,1> Pi, Matrix<floatPrec, 4,1> Pi_B)
{

	// project points P1 and P1_B to planes Pi and Pi_B
	Matrix<floatPrec, 4,1> P1_pi, P1_pi_B;
	P1_pi.head(3) = P1.head(3) - (P1.head(3).dot(Pi.head(3)) + Pi(3)) * Pi.head(3);
	P1_pi(3) = 1.0;
	P1_pi_B.head(3) = P1_B.head(3) - (P1_B.head(3).dot(Pi_B.head(3)) + Pi_B(3)) * Pi_B.head(3);
	P1_pi_B(3) = 1.0;

	// translate frames to P1_pi and P1_pi_B
	Matrix<floatPrec, 4,4> transU, transU_B;
	transU.setIdentity(4,4);
	transU.topRightCorner(3, 1) = -P1_pi.head(3);
	transU_B.setIdentity(4,4);
	transU_B.topRightCorner(3, 1) = -P1_pi_B.head(3);

	// transform P2 and P2_B to the new frame
	Matrix<floatPrec, 4,1> Pi_1, Pi_B1;
	Pi_1 = transU.transpose().inverse() * Pi;
	Pi_B1 = transU_B.transpose().inverse() * Pi_B;

	// aling planes Pi and Pi_B with XY planes of both frames
	Matrix<floatPrec, 4,4> transV, transV_B;
	transV.setIdentity(4,4);
	transV_B.setIdentity(4,4);

	// compute rotation ref A
	Matrix<floatPrec, 3,1> v3, v1, v1_, t1, t2;
	t1.setZero();
	t1(0) = 1;
	t2.setZero();
	t2(1) = 1;
	v3 = Pi_1.head(3).normalized();
	v1 = t1.cross(v3);
	v1_ = t2.cross(v3);
	if (v1.norm() >= v1_.norm())
	{
		v1 = v1.normalized();
	}
	else
	{
		v1 = v1_.normalized();
	}
	transV.topLeftCorner(1, 3) = v1.transpose();
	transV.block(1, 0, 1, 3) = v3.cross(v1).transpose();
	transV.block(2, 0, 1, 3) = v3.transpose();

	// compute rotation ref B
	v3 = Pi_B1.head(3).normalized();
	v1 = t1.cross(v3);
	v1_ = t2.cross(v3);
	if (v1.norm() >= v1_.norm())
	{
		v1 = v1.normalized();
	}
	else
	{
		v1 = v1_.normalized();
	}
	transV_B.topLeftCorner(1, 3) = v1.transpose();
	transV_B.block(1, 0, 1, 3) = v3.cross(v1).transpose();
	transV_B.block(2, 0, 1, 3) = v3.transpose();

	vector<Matrix<floatPrec, 4,4>> out;
	Matrix<floatPrec, 4,4> TP, TP_B;
	TP = transV * transU;
	out.push_back(TP);

	TP_B = transV_B * transU_B;
	out.push_back(TP_B);

	return out;
}